

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

void __thiscall
llama_model_loader::init_mappings(llama_model_loader *this,bool prefetch,llama_mlocks *mlock_mmaps)

{
  bool bVar1;
  undefined8 uVar2;
  reference ppVar3;
  long lVar4;
  long in_RDX;
  byte in_SIL;
  long in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
  *__range1;
  unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> mlock_mmap;
  unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> mapping;
  _func_bool *is_numa_fn;
  ggml_backend_reg *reg;
  unique_ptr<llama_file,_std::default_delete<llama_file>_> *file;
  iterator __end2;
  iterator __begin2;
  llama_files *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
  *in_stack_ffffffffffffff08;
  __normal_iterator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_*,_std::vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>_>
  *in_stack_ffffffffffffff10;
  unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> *in_stack_ffffffffffffff18;
  EVP_PKEY_CTX *in_stack_ffffffffffffff20;
  bool *in_stack_ffffffffffffff28;
  llama_file **in_stack_ffffffffffffff38;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffff40;
  _Self local_98;
  _Self local_90;
  long local_88;
  __normal_iterator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_*,_std::vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>_>
  local_80;
  undefined4 local_78;
  size_t local_68;
  undefined1 local_5d;
  int local_5c;
  pointer local_58;
  int local_50 [2];
  code *local_48;
  undefined8 local_40;
  reference local_38;
  unique_ptr<llama_file,_std::default_delete<llama_file>_> *local_30;
  __normal_iterator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_*,_std::vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>_>
  local_28;
  long local_20;
  long local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
    local_18 = in_RDX;
    std::
    vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
    ::size((vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
            *)(in_RDI + 0x28));
    std::
    vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
    ::reserve((vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
               *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    std::
    vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
    ::size((vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
            *)(in_RDI + 0x28));
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve(in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    local_20 = in_RDI + 0x28;
    local_28._M_current =
         (unique_ptr<llama_file,_std::default_delete<llama_file>_> *)
         std::
         vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
         ::begin((vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                  *)in_stack_ffffffffffffff08);
    local_30 = (unique_ptr<llama_file,_std::default_delete<llama_file>_> *)
               std::
               vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
               ::end((vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                      *)in_stack_ffffffffffffff08);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff10,
                              (__normal_iterator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_*,_std::vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>_>
                               *)in_stack_ffffffffffffff08), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_*,_std::vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>_>
                 ::operator*(&local_28);
      uVar2 = ggml_backend_dev_by_type(0);
      local_40 = ggml_backend_dev_backend_reg(uVar2);
      local_48 = (code *)ggml_backend_reg_get_proc_address(local_40,"ggml_backend_cpu_is_numa");
      local_58 = std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::get
                           ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)
                            in_stack_ffffffffffffff10);
      local_5c = -(local_9 & 1);
      local_5d = (*local_48)();
      std::make_unique<llama_mmap,llama_file*,int,bool>
                (in_stack_ffffffffffffff38,local_50,in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff38 = (llama_file **)(in_RDI + 0x130);
      std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::operator->
                ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)0x451bf9);
      local_68 = llama_mmap::size((llama_mmap *)0x451c01);
      local_78 = 0;
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<unsigned_long,int>
                ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)in_stack_ffffffffffffff20,(unsigned_long *)in_stack_ffffffffffffff18,
                 (int *)in_stack_ffffffffffffff10);
      if (local_18 != 0) {
        in_stack_ffffffffffffff28 = (bool *)operator_new(8);
        llama_mlock::llama_mlock((llama_mlock *)0x451c66);
        in_stack_ffffffffffffff10 = &local_80;
        std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>::
        unique_ptr<std::default_delete<llama_mlock>,void>
                  ((unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> *)
                   in_stack_ffffffffffffff10,(pointer)in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff18 =
             (unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> *)
             std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>::operator->
                       ((unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> *)0x451c86);
        std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::operator->
                  ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)0x451c98);
        in_stack_ffffffffffffff20 = (EVP_PKEY_CTX *)llama_mmap::addr((llama_mmap *)0x451ca0);
        llama_mlock::init((llama_mlock *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
        std::
        vector<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>,std::allocator<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>>
        ::emplace_back<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>
                  ((vector<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>,_std::allocator<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>_>_>
                    *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>::~unique_ptr
                  ((unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> *)
                   in_stack_ffffffffffffff10);
      }
      std::
      vector<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>,std::allocator<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>>>
      ::emplace_back<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>>
                ((vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                  *)in_stack_ffffffffffffff20,
                 (unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)
                 in_stack_ffffffffffffff18);
      std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::~unique_ptr
                ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)
                 in_stack_ffffffffffffff20);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_*,_std::vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>_>
      ::operator++(&local_28);
    }
  }
  local_88 = in_RDI + 0x60;
  local_90._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
       ::begin(in_stack_ffffffffffffff08);
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
       ::end(in_stack_ffffffffffffff08);
  while (bVar1 = std::operator!=(&local_90,&local_98), bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>
                          *)0x451dc9);
    lVar4 = ggml_nbytes((ppVar3->second).tensor);
    *(long *)(in_RDI + 0x128) = lVar4 + *(long *)(in_RDI + 0x128);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>
                  *)in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void llama_model_loader::init_mappings(bool prefetch, llama_mlocks * mlock_mmaps) {
    if (use_mmap) {
        mappings.reserve(files.size());
        mmaps_used.reserve(files.size());
        for (const auto & file : files) {
            auto * reg = ggml_backend_dev_backend_reg(ggml_backend_dev_by_type(GGML_BACKEND_DEVICE_TYPE_CPU));
            auto * is_numa_fn = (decltype(ggml_is_numa) *) ggml_backend_reg_get_proc_address(reg, "ggml_backend_cpu_is_numa");
            std::unique_ptr<llama_mmap> mapping = std::make_unique<llama_mmap>(file.get(), prefetch ? -1 : 0, is_numa_fn());
            mmaps_used.emplace_back(mapping->size(), 0);
            if (mlock_mmaps) {
                std::unique_ptr<llama_mlock> mlock_mmap(new llama_mlock());
                mlock_mmap->init(mapping->addr());
                mlock_mmaps->emplace_back(std::move(mlock_mmap));
            }
            mappings.emplace_back(std::move(mapping));
        }
    }

    // compute the total size of all tensors for progress reporting
    for (const auto & it : weights_map) {
        size_data += ggml_nbytes(it.second.tensor);
    }
}